

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

AssetInfo * __thiscall
tinyusdz::PrimMetas::get_assetInfo
          (AssetInfo *__return_storage_ptr__,PrimMetas *this,bool *is_authored)

{
  bool bVar1;
  allocator local_2f9;
  key_type_conflict local_2f8;
  undefined1 local_2d8 [8];
  string version;
  string local_2b0;
  undefined1 local_290 [8];
  MetaVariable version_var;
  key_type_conflict local_250;
  undefined1 local_230 [8];
  vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> assets;
  string local_210;
  undefined1 local_1f0 [8];
  MetaVariable payloadDeps_var;
  key_type_conflict local_1b0;
  undefined1 local_190 [8];
  string name;
  string local_168;
  undefined1 local_148 [8];
  MetaVariable name_var;
  key_type_conflict local_108;
  AssetPath local_e8;
  undefined1 local_a8 [8];
  string identifier;
  string local_80;
  undefined1 local_60 [8];
  MetaVariable identifier_var;
  bool *is_authored_local;
  PrimMetas *this_local;
  AssetInfo *ainfo;
  
  identifier_var._name.field_2._M_local_buf[0xf] = '\0';
  AssetInfo::AssetInfo(__return_storage_ptr__);
  if (is_authored != (bool *)0x0) {
    bVar1 = authored(this);
    *is_authored = bVar1;
  }
  bVar1 = authored(this);
  if (bVar1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                 *)&__return_storage_ptr__->_fields,
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                 *)&this->meta);
    MetaVariable::MetaVariable((MetaVariable *)local_60);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_80,"identifier",(allocator *)(identifier.field_2._M_local_buf + 0xf)
              );
    bVar1 = GetCustomDataByKey(&this->meta,&local_80,(MetaVariable *)local_60);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::allocator<char>::~allocator((allocator<char> *)(identifier.field_2._M_local_buf + 0xf));
    if (bVar1) {
      ::std::__cxx11::string::string((string *)local_a8);
      bVar1 = MetaVariable::get_value<std::__cxx11::string>
                        ((MetaVariable *)local_60,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8);
      if (bVar1) {
        tinyusdz::value::AssetPath::AssetPath(&local_e8,(string *)local_a8);
        tinyusdz::value::AssetPath::operator=(&__return_storage_ptr__->identifier,&local_e8);
        tinyusdz::value::AssetPath::~AssetPath(&local_e8);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_108,"identifier",
                   (allocator *)(name_var._name.field_2._M_local_buf + 0xf));
        ::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::erase(&__return_storage_ptr__->_fields,&local_108);
        ::std::__cxx11::string::~string((string *)&local_108);
        ::std::allocator<char>::~allocator
                  ((allocator<char> *)(name_var._name.field_2._M_local_buf + 0xf));
      }
      ::std::__cxx11::string::~string((string *)local_a8);
    }
    MetaVariable::~MetaVariable((MetaVariable *)local_60);
    MetaVariable::MetaVariable((MetaVariable *)local_148);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_168,"name",(allocator *)(name.field_2._M_local_buf + 0xf));
    bVar1 = GetCustomDataByKey(&this->meta,&local_168,(MetaVariable *)local_148);
    ::std::__cxx11::string::~string((string *)&local_168);
    ::std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
    if (bVar1) {
      ::std::__cxx11::string::string((string *)local_190);
      bVar1 = MetaVariable::get_value<std::__cxx11::string>
                        ((MetaVariable *)local_148,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_190);
      if (bVar1) {
        ::std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->name,(string *)local_190);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_1b0,"name",
                   (allocator *)(payloadDeps_var._name.field_2._M_local_buf + 0xf));
        ::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::erase(&__return_storage_ptr__->_fields,&local_1b0);
        ::std::__cxx11::string::~string((string *)&local_1b0);
        ::std::allocator<char>::~allocator
                  ((allocator<char> *)(payloadDeps_var._name.field_2._M_local_buf + 0xf));
      }
      ::std::__cxx11::string::~string((string *)local_190);
    }
    MetaVariable::~MetaVariable((MetaVariable *)local_148);
    MetaVariable::MetaVariable((MetaVariable *)local_1f0);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_210,"payloadAssetDependencies",
               (allocator *)
               ((long)&assets.
                       super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    bVar1 = GetCustomDataByKey(&this->meta,&local_210,(MetaVariable *)local_1f0);
    ::std::__cxx11::string::~string((string *)&local_210);
    ::std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&assets.
                       super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    if (bVar1) {
      ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::vector
                ((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
                 local_230);
      bVar1 = MetaVariable::
              get_value<std::vector<tinyusdz::value::AssetPath,std::allocator<tinyusdz::value::AssetPath>>>
                        ((MetaVariable *)local_1f0,
                         (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                          *)local_230);
      if (bVar1) {
        ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
        operator=(&__return_storage_ptr__->payloadAssetDependencies,
                  (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *
                  )local_230);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_250,"payloadAssetDependencies",
                   (allocator *)(version_var._name.field_2._M_local_buf + 0xf));
        ::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::erase(&__return_storage_ptr__->_fields,&local_250);
        ::std::__cxx11::string::~string((string *)&local_250);
        ::std::allocator<char>::~allocator
                  ((allocator<char> *)(version_var._name.field_2._M_local_buf + 0xf));
      }
      ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
      ~vector((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
              local_230);
    }
    MetaVariable::~MetaVariable((MetaVariable *)local_1f0);
    MetaVariable::MetaVariable((MetaVariable *)local_290);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_2b0,"version",(allocator *)(version.field_2._M_local_buf + 0xf));
    bVar1 = GetCustomDataByKey(&this->meta,&local_2b0,(MetaVariable *)local_290);
    ::std::__cxx11::string::~string((string *)&local_2b0);
    ::std::allocator<char>::~allocator((allocator<char> *)(version.field_2._M_local_buf + 0xf));
    if (bVar1) {
      ::std::__cxx11::string::string((string *)local_2d8);
      bVar1 = MetaVariable::get_value<std::__cxx11::string>
                        ((MetaVariable *)local_290,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2d8);
      if (bVar1) {
        ::std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->version,(string *)local_2d8);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_2f8,"version",&local_2f9);
        ::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::erase(&__return_storage_ptr__->_fields,&local_2f8);
        ::std::__cxx11::string::~string((string *)&local_2f8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      }
      ::std::__cxx11::string::~string((string *)local_2d8);
    }
    MetaVariable::~MetaVariable((MetaVariable *)local_290);
  }
  return __return_storage_ptr__;
}

Assistant:

AssetInfo PrimMeta::get_assetInfo(bool *is_authored) const {
  AssetInfo ainfo;

  if (is_authored) {
    (*is_authored) = authored();
  }

  if (authored()) {
    ainfo._fields = meta;

    {
      MetaVariable identifier_var;
      if (GetCustomDataByKey(meta, "identifier", &identifier_var)) {
        std::string identifier;
        if (identifier_var.get_value<std::string>(&identifier)) {
          ainfo.identifier = identifier;
          ainfo._fields.erase("identifier");
        }
      }
    }

    {
      MetaVariable name_var;
      if (GetCustomDataByKey(meta, "name", &name_var)) {
        std::string name;
        if (name_var.get_value<std::string>(&name)) {
          ainfo.name = name;
          ainfo._fields.erase("name");
        }
      }
    }

    {
      MetaVariable payloadDeps_var;
      if (GetCustomDataByKey(meta, "payloadAssetDependencies",
                             &payloadDeps_var)) {
        std::vector<value::AssetPath> assets;
        if (payloadDeps_var.get_value<std::vector<value::AssetPath>>(&assets)) {
          ainfo.payloadAssetDependencies = assets;
          ainfo._fields.erase("payloadAssetDependencies");
        }
      }
    }

    {
      MetaVariable version_var;
      if (GetCustomDataByKey(meta, "version", &version_var)) {
        std::string version;
        if (version_var.get_value<std::string>(&version)) {
          ainfo.version = version;
          ainfo._fields.erase("version");
        }
      }
    }
  }

  return ainfo;
}